

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O1

string * __thiscall
cmFindLibraryCommand::FindFrameworkLibraryDirsPerName_abi_cxx11_
          (string *__return_storage_ptr__,cmFindLibraryCommand *this)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  string *d;
  pointer pbVar4;
  string *n;
  pointer pbVar5;
  string fwPath;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  pbVar5 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar1) {
    do {
      pbVar2 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar4 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar2; pbVar4 = pbVar4 + 1
          ) {
        std::__cxx11::string::_M_assign((string *)&local_50);
        std::__cxx11::string::_M_append((char *)&local_50,(ulong)(pbVar5->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_50);
        bVar3 = cmsys::SystemTools::FileIsDirectory(&local_50);
        if (bVar3) {
          cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,&local_50);
          if (bVar3) goto LAB_00240a8c;
        }
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_00240a8c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindLibraryCommand::FindFrameworkLibraryDirsPerName()
{
  std::string fwPath;
  // Search for each name in all search paths.
  for (std::string const& n : this->Names) {
    for (std::string const& d : this->SearchPaths) {
      fwPath = d;
      fwPath += n;
      fwPath += ".framework";
      if (cmSystemTools::FileIsDirectory(fwPath)) {
        return cmSystemTools::CollapseFullPath(fwPath);
      }
    }
  }

  // No framework found.
  return "";
}